

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O0

int getFD(int adr,int heap)

{
  FILE *pFVar1;
  FILE *cfd;
  int *P;
  int cnt;
  int heap_local;
  int adr_local;
  
  P._4_4_ = 0;
  cfd = (FILE *)M;
  cnt = adr;
  if (heap != 0) {
    cfd = (FILE *)H;
  }
  for (; (&cfd->_flags)[cnt] != 0; cnt = cnt + 1) {
    tmp[P._4_4_] = (char)(&cfd->_flags)[cnt];
    P._4_4_ = P._4_4_ + 1;
  }
  fd = fd + 1;
  pFVar1 = fopen(tmp,"r");
  fds[fd] = (FILE *)pFVar1;
  return fd;
}

Assistant:

int getFD(int adr, int heap) {
	int cnt = 0; int *P = M;
	FILE *cfd;
	if (heap) { P=H;}
	while (P[adr]!=0) { 
		tmp[cnt++]=(char)P[adr];
		adr++;
	}
	fd++;
	cfd = fopen(tmp,"r");
	fds[fd] = cfd;
	return fd;
}